

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebuggerAdapter.cxx
# Opt level: O1

void __thiscall
cmDebugger::cmDebuggerAdapter::OnMessageOutput(cmDebuggerAdapter *this,MessageType t,string *text)

{
  Session *pSVar1;
  Semaphore *pSVar2;
  int iVar3;
  TypeInfo *pTVar4;
  optional<dap::StoppedEvent> stoppedEvent;
  unique_lock<std::mutex> local_e0;
  _Optional_payload_base<dap::StoppedEvent> local_d0;
  
  cmDebuggerExceptionManager::RaiseExceptionIfAny
            ((optional<dap::StoppedEvent> *)&local_d0,
             (this->ExceptionManager)._M_t.
             super___uniq_ptr_impl<cmDebugger::cmDebuggerExceptionManager,_std::default_delete<cmDebugger::cmDebuggerExceptionManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmDebugger::cmDebuggerExceptionManager_*,_std::default_delete<cmDebugger::cmDebuggerExceptionManager>_>
             .super__Head_base<0UL,_cmDebugger::cmDebuggerExceptionManager_*,_false>._M_head_impl,t,
             text);
  if (local_d0._M_engaged == true) {
    local_d0._M_payload._M_value.threadId.val.val =
         (integer)((this->DefaultThread).
                   super___shared_ptr<cmDebugger::cmDebuggerThread,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->Id;
    local_d0._M_payload._M_value.threadId.set = true;
    pSVar1 = (this->Session)._M_t.
             super___uniq_ptr_impl<dap::Session,_std::default_delete<dap::Session>_>._M_t.
             super__Tuple_impl<0UL,_dap::Session_*,_std::default_delete<dap::Session>_>.
             super__Head_base<0UL,_dap::Session_*,_false>._M_head_impl;
    pTVar4 = dap::TypeOf<dap::StoppedEvent>::type();
    (*pSVar1->_vptr_Session[0xb])(pSVar1,pTVar4,&local_d0);
    pSVar2 = (this->ContinueSem)._M_t.
             super___uniq_ptr_impl<cmDebugger::Semaphore,_std::default_delete<cmDebugger::Semaphore>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmDebugger::Semaphore_*,_std::default_delete<cmDebugger::Semaphore>_>
             .super__Head_base<0UL,_cmDebugger::Semaphore_*,_false>._M_head_impl;
    local_e0._M_owns = false;
    local_e0._M_device = &pSVar2->Mutex;
    std::unique_lock<std::mutex>::lock(&local_e0);
    local_e0._M_owns = true;
    iVar3 = pSVar2->Count;
    if (iVar3 == 0) {
      do {
        std::condition_variable::wait((unique_lock *)&pSVar2->Cv);
        iVar3 = pSVar2->Count;
      } while (iVar3 == 0);
    }
    pSVar2->Count = iVar3 + -1;
    std::unique_lock<std::mutex>::~unique_lock(&local_e0);
  }
  if (local_d0._M_engaged == true) {
    std::_Optional_payload_base<dap::StoppedEvent>::_M_destroy(&local_d0);
  }
  return;
}

Assistant:

void cmDebuggerAdapter::OnMessageOutput(MessageType t, std::string const& text)
{
  cm::optional<dap::StoppedEvent> stoppedEvent =
    ExceptionManager->RaiseExceptionIfAny(t, text);
  if (stoppedEvent.has_value()) {
    stoppedEvent->threadId = DefaultThread->GetId();
    Session->send(*stoppedEvent);
    ContinueSem->Wait();
  }
}